

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes_remove_degenerate(par_shapes_mesh *mesh,float mintriarea)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  float *pfVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  long *in_FS_OFFSET;
  float fVar7;
  float cplen2;
  float *pc;
  float *pb;
  float *pa;
  int f;
  float mincplen2;
  float cp [3];
  float prev [3];
  float next [3];
  uint16_t *src;
  uint16_t *dst;
  uint16_t *triangles;
  int ntriangles;
  float mintriarea_local;
  par_shapes_mesh *mesh_local;
  
  triangles._0_4_ = 0;
  puVar5 = (uint16_t *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  next._4_8_ = mesh->triangles;
  src = puVar5;
  for (pa._4_4_ = 0; pa._4_4_ < mesh->ntriangles; pa._4_4_ = pa._4_4_ + 1) {
    pfVar3 = mesh->points;
    uVar1 = *(ushort *)next._4_8_;
    pfVar4 = mesh->points;
    uVar2 = *(ushort *)(next._4_8_ + 4);
    par_shapes__copy3(prev + 1,mesh->points + (int)((uint)*(ushort *)(next._4_8_ + 2) * 3));
    par_shapes__subtract3(prev + 1,pfVar3 + (int)((uint)uVar1 * 3));
    par_shapes__copy3(cp + 1,pfVar4 + (int)((uint)uVar2 * 3));
    par_shapes__subtract3(cp + 1,pfVar3 + (int)((uint)uVar1 * 3));
    par_shapes__cross3((float *)&f,prev + 1,cp + 1);
    fVar7 = par_shapes__dot3((float *)&f,(float *)&f);
    if (mintriarea * 2.0 * mintriarea * 2.0 <= fVar7) {
      *src = *(uint16_t *)next._4_8_;
      puVar6 = src + 2;
      src[1] = *(uint16_t *)(next._4_8_ + 2);
      src = src + 3;
      *puVar6 = *(uint16_t *)(next._4_8_ + 4);
      triangles._0_4_ = (int)triangles + 1;
    }
    next._4_8_ = next._4_8_ + 6;
  }
  mesh->ntriangles = (int)triangles;
  (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
  mesh->triangles = puVar5;
  return;
}

Assistant:

PARDEF void par_shapes_remove_degenerate(par_shapes_mesh* mesh, float mintriarea)
{
    int ntriangles = 0;
    PAR_SHAPES_T* triangles = PAR_MALLOC(PAR_SHAPES_T, mesh->ntriangles * 3);
    PAR_SHAPES_T* dst = triangles;
    PAR_SHAPES_T const* src = mesh->triangles;
    float next[3], prev[3], cp[3];
    float mincplen2 = (mintriarea * 2) * (mintriarea * 2);
    for (int f = 0; f < mesh->ntriangles; f++, src += 3) {
        float const* pa = mesh->points + 3 * src[0];
        float const* pb = mesh->points + 3 * src[1];
        float const* pc = mesh->points + 3 * src[2];
        par_shapes__copy3(next, pb);
        par_shapes__subtract3(next, pa);
        par_shapes__copy3(prev, pc);
        par_shapes__subtract3(prev, pa);
        par_shapes__cross3(cp, next, prev);
        float cplen2 = par_shapes__dot3(cp, cp);
        if (cplen2 >= mincplen2) {
            *dst++ = src[0];
            *dst++ = src[1];
            *dst++ = src[2];
            ntriangles++;
        }
    }
    mesh->ntriangles = ntriangles;
    PAR_FREE(mesh->triangles);
    mesh->triangles = triangles;
}